

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaExporter::WriteTextureColorEntry
          (ColladaExporter *this,Surface *pSurface,string *pTypeName,string *pImageName)

{
  undefined1 *puVar1;
  size_type sVar2;
  ostream *poVar3;
  string local_50;
  
  if (pSurface->exist == true) {
    puVar1 = &this->field_0x38;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pTypeName->_M_dataplus)._M_p,pTypeName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)&this->startstr);
    sVar2 = (pSurface->texture)._M_string_length;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    if (sVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<color sid=\"",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(pTypeName->_M_dataplus)._M_p,pTypeName->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">",2);
      poVar3 = std::ostream::_M_insert<double>((double)(pSurface->color).r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"   ",3);
      poVar3 = std::ostream::_M_insert<double>((double)(pSurface->color).g);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"   ",3);
      poVar3 = std::ostream::_M_insert<double>((double)(pSurface->color).b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"   ",3);
      poVar3 = std::ostream::_M_insert<double>((double)(pSurface->color).a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</color>",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<texture texture=\"",0x12);
      XMLIDEncode(&local_50,pImageName);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" texcoord=\"CHANNEL",0x13);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" />",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    PopTag(this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pTypeName->_M_dataplus)._M_p,pTypeName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  return;
}

Assistant:

void ColladaExporter::WriteTextureColorEntry( const Surface& pSurface, const std::string& pTypeName, const std::string& pImageName)
{
  if(pSurface.exist) {
    mOutput << startstr << "<" << pTypeName << ">" << endstr;
    PushTag();
    if( pSurface.texture.empty() )
    {
      mOutput << startstr << "<color sid=\"" << pTypeName << "\">" << pSurface.color.r << "   " << pSurface.color.g << "   " << pSurface.color.b << "   " << pSurface.color.a << "</color>" << endstr;
    }
    else
    {
      mOutput << startstr << "<texture texture=\"" << XMLIDEncode(pImageName) << "\" texcoord=\"CHANNEL" << pSurface.channel << "\" />" << endstr;
    }
    PopTag();
    mOutput << startstr << "</" << pTypeName << ">" << endstr;
  }
}